

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O3

void duckdb::ApplySliceRecursive
               (Vector *source_v,TupleDataVectorFormat *source_format,SelectionVector *combined_sel,
               idx_t count)

{
  SelectionVector *this;
  unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true> *this_00
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_> __ptr
  ;
  undefined8 uVar1;
  type pCVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_02;
  const_reference this_03;
  type source_v_00;
  reference source_format_00;
  _Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
  this_04;
  size_type __n;
  pointer __p;
  undefined1 local_58 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  vector<duckdb::TupleDataVectorFormat,_true> *local_38;
  
  pCVar2 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
           ::operator*(&source_format->combined_list_data);
  SelectionVector::Slice
            ((SelectionVector *)local_58,source_format->original_sel,(idx_t)combined_sel);
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
  uVar1 = local_58._0_8_;
  local_58._0_8_ = (CombinedListData *)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pCVar2->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  this_01 = (pCVar2->selection_data).internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pCVar2->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_40
  ;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    local_40 = (pCVar2->selection_data).internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  }
  this = &(source_format->unified).owned_sel;
  local_58._16_8_ =
       (pCVar2->selection_data).internal.
       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  SelectionVector::Initialize(this,(buffer_ptr<SelectionData> *)(local_58 + 0x10));
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  (source_format->unified).sel = this;
  if (((source_v->type).physical_type_ == STRUCT) &&
     (this_02 = StructVector::GetEntries(source_v),
     (this_02->
     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
     ).
     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     (this_02->
     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
     ).
     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    local_38 = &source_format->children;
    __n = 0;
    do {
      this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_02,__n);
      source_v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_03);
      source_format_00 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](local_38,__n);
      if ((source_format_00->combined_list_data).
          super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
          .super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl ==
          (CombinedListData *)0x0) {
        this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::CombinedListData_*,_false>)operator_new(0x8078);
        UnifiedVectorFormat::UnifiedVectorFormat
                  ((UnifiedVectorFormat *)
                   this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl);
        this_00 = &source_format_00->combined_list_data;
        *(undefined8 *)
         ((long)this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl + 0x48
         ) = 0;
        *(undefined8 *)
         ((long)this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl + 0x50
         ) = 0;
        *(undefined8 *)
         ((long)this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl +
         0x8058) = 0;
        *(undefined8 *)
         ((long)this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl +
         0x8060) = 0;
        *(undefined8 *)
         ((long)this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl +
         0x8068) = 0;
        *(undefined8 *)
         ((long)this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl +
         0x8070) = 0x800;
        local_58._0_8_ = (CombinedListData *)0x0;
        __ptr.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl =
             (this_00->
             super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
             .super__Head_base<0UL,_duckdb::CombinedListData_*,_false>;
        (this_00->
        super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
        .super__Head_base<0UL,_duckdb::CombinedListData_*,_false> =
             this_04.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl;
        if ((__ptr.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl !=
             (CombinedListData *)0x0) &&
           (::std::default_delete<duckdb::CombinedListData>::operator()
                      ((default_delete<duckdb::CombinedListData> *)this_00,
                       (CombinedListData *)
                       __ptr.super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl),
           (CombinedListData *)local_58._0_8_ != (CombinedListData *)0x0)) {
          ::std::default_delete<duckdb::CombinedListData>::operator()
                    ((default_delete<duckdb::CombinedListData> *)local_58,
                     (CombinedListData *)local_58._0_8_);
        }
      }
      ApplySliceRecursive(source_v_00,source_format_00,(source_format->unified).sel,count);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_02->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_02->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void ApplySliceRecursive(const Vector &source_v, TupleDataVectorFormat &source_format,
                                const SelectionVector &combined_sel, const idx_t count) {
	D_ASSERT(source_format.combined_list_data);
	auto &combined_list_data = *source_format.combined_list_data;

	combined_list_data.selection_data = source_format.original_sel->Slice(combined_sel, count);
	source_format.unified.owned_sel.Initialize(combined_list_data.selection_data);
	source_format.unified.sel = &source_format.unified.owned_sel;

	if (source_v.GetType().InternalType() == PhysicalType::STRUCT) {
		// We have to apply it to the child vectors too
		auto &struct_sources = StructVector::GetEntries(source_v);
		for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
			auto &struct_source = *struct_sources[struct_col_idx];
			auto &struct_format = source_format.children[struct_col_idx];
#ifdef DEBUG
			D_ASSERT(!struct_format.combined_list_data);
#endif
			if (!struct_format.combined_list_data) {
				struct_format.combined_list_data = make_uniq<CombinedListData>();
			}
			ApplySliceRecursive(struct_source, struct_format, *source_format.unified.sel, count);
		}
	}
}